

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O1

int mainMenu(ifstream *loadFile,ofstream *compressedFile,ofstream *mapper)

{
  undefined8 extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_RBP;
  int *piVar1;
  undefined1 *unaff_R13;
  string folderName;
  int userChoice;
  string fileName;
  int *local_d8;
  long local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  string local_b8;
  int local_94;
  string local_90;
  string local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Welcome to Pied Piper the brand new middle out compression engine",0x41);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Please select what you would like to do...",0x2a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1) Compress File",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"2) Decompress File",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"3) Close Program and install virus",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  piVar1 = &local_94;
  local_94 = 0;
  std::istream::operator>>((istream *)&std::cin,piVar1);
  if (local_94 == 3) {
    return 0;
  }
  if (local_94 != 2) {
    if (local_94 != 1) goto LAB_00102cf6;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Please enter the folder path to where you would like to save .pra file...",0x49);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    piVar1 = (int *)&local_c8;
    local_d0 = 0;
    local_c8 = 0;
    local_d8 = piVar1;
    std::operator>>((istream *)&std::cin,(string *)&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Please enter directory of file with file name...",0x30);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    unaff_R13 = &local_40;
    local_48 = 0;
    local_40 = 0;
    local_50 = unaff_R13;
    std::operator>>((istream *)&std::cin,(string *)&local_50);
    unaff_RBP = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)unaff_RBP;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_d8,local_d0 + (long)local_d8);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_50,local_50 + local_48);
    initalizeFiles(loadFile,compressedFile,mapper,&local_70,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != unaff_RBP) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"COMPRESSING.....",0x10);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    precompress = true;
    middleOut(true,loadFile,compressedFile);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Please enter the path of the folder containing the .pra mapper and compressed file",
             0x52);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_d8 = (int *)&local_c8;
  local_d0 = 0;
  local_c8 = 0;
  std::operator>>((istream *)&std::cin,(string *)&local_d8);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_d8,local_d0 + (long)local_d8);
  decompress(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DECOMPRESSING...",0x10);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_d8);
LAB_00102cf6:
  mainMenu();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != unaff_RBP) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != unaff_R13) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if (local_d8 != piVar1) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int mainMenu(ifstream &loadFile, ofstream &compressedFile, ofstream &mapper)
{

    // Display user cmd line interface for selection if they want to compress or decmopress or close programm
    cout << "Welcome to Pied Piper the brand new middle out compression engine"<< endl;
    cout << "Please select what you would like to do..."<< endl;
    cout << "1) Compress File" << endl;
    cout << "2) Decompress File" <<endl;
    cout << "3) Close Program and install virus"<<endl;

    // Take in user input
    int userChoice = 0;
    cin >> userChoice;

    // Check agianst choices
    if (userChoice == 1)
    {
        // Compress File

        // If compressing take in the folder they want the .pra files stored I recommend a folder called Compressed
        cout << "Please enter the folder path to where you would like to save .pra file..." <<endl;
        string folderName;
        cin >> folderName;

        // Ask the user to enter the path to the source file they want to try and compress

        cout << "Please enter directory of file with file name..." <<endl;
        string fileName;
        cin >> fileName;


        // Initialize the fstreams based on the values passed in by the user
        initalizeFiles(loadFile, compressedFile, mapper, folderName, fileName);

        cout << endl; // Display cleanup

        // Inform the user compression is starting
        // TODO: Add progress bar
        cout << "COMPRESSING....."<<endl;

        // Parse through the file once looking for unique words and saving the top three used with corresponding single
        // byte representations
        preCompress(loadFile, compressedFile);

        // Parse through file a second time this time looking for any word matching the top three from preCompression
        // and replacing them with the single byte mapping
        compressor(loadFile, compressedFile, mapper);


    }
    else if (userChoice == 2)
    {
        // Decompress File
        // If Decompressing have user enter folder of .pra files
        cout << "Please enter the path of the folder containing the .pra mapper and compressed file"<<endl;
        string folderName;
        cin >> folderName;

        // Run decopression saving a new decmopressed file in the same folder as the main.cpp file and call it
        // Decmpressed.txt
        // TODO: Change save directory to compressed .pra folder and resave as original source file name

        decompress(folderName);

        // Inform the user its decompressing their file
        cout << endl;

        cout << "DECOMPRESSING..." <<endl;
    }
    else if (userChoice == 3)
    {
        // Close the program

        return 0;

    }
    else
    {
        // User did not select 1-3
        cerr << "Not a valid choice pick again..." <<endl;

    }
}